

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockBuilderCopyDockSpace
               (ImGuiID src_dockspace_id,ImGuiID dst_dockspace_id,
               ImVector<const_char_*> *in_window_remap_pairs)

{
  char *data_p;
  char *dst_name;
  bool bVar1;
  ImGuiID IVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindowSettings *pIVar4;
  ImGuiDockNode *pIVar5;
  long lVar6;
  int window_n;
  int remap_window_n;
  long lVar7;
  ImGuiID src_window_id;
  ImVector<unsigned_int> node_remap_pairs;
  ImVector<unsigned_int> src_windows;
  ImGuiID local_5c;
  ImVector<unsigned_int> local_58;
  ImVector<unsigned_int> local_48;
  
  local_58.Size = 0;
  local_58.Capacity = 0;
  local_58.Data = (uint *)0x0;
  DockBuilderCopyNode(src_dockspace_id,dst_dockspace_id,&local_58);
  local_48.Size = 0;
  local_48.Capacity = 0;
  local_48.Data = (uint *)0x0;
  lVar7 = 0;
  do {
    if (*(int *)in_window_remap_pairs <= lVar7) {
      for (lVar7 = 0; lVar7 < local_58.Size; lVar7 = lVar7 + 2) {
        if (local_58.Data[lVar7] != 0) {
          IVar2 = local_58.Data[lVar7 + 1];
          pIVar5 = DockBuilderGetNode(local_58.Data[lVar7]);
          for (lVar6 = 0; lVar6 < (pIVar5->Windows).Size; lVar6 = lVar6 + 1) {
            pIVar3 = (pIVar5->Windows).Data[lVar6];
            bVar1 = ImVector<unsigned_int>::contains(&local_48,&pIVar3->ID);
            if (!bVar1) {
              DockBuilderDockWindow(pIVar3->Name,IVar2);
            }
          }
        }
      }
      ImVector<unsigned_int>::~ImVector(&local_48);
      ImVector<unsigned_int>::~ImVector(&local_58);
      return;
    }
    data_p = *(char **)(*(long *)(in_window_remap_pairs + 8) + lVar7 * 8);
    dst_name = *(char **)(*(long *)(in_window_remap_pairs + 8) + 8 + lVar7 * 8);
    local_5c = ImHashStr(data_p,0,0);
    ImVector<unsigned_int>::push_back(&local_48,&local_5c);
    IVar2 = local_5c;
    pIVar3 = FindWindowByID(local_5c);
    if (pIVar3 == (ImGuiWindow *)0x0) {
      pIVar4 = FindWindowSettings(IVar2);
      if (pIVar4 == (ImGuiWindowSettings *)0x0) {
        IVar2 = 0;
      }
      else {
        IVar2 = pIVar4->DockId;
      }
    }
    else {
      IVar2 = pIVar3->DockId;
    }
    for (lVar6 = 0; lVar6 < local_58.Size; lVar6 = lVar6 + 2) {
      if (local_58.Data[lVar6] == IVar2) {
        if (local_58.Data[lVar6 + 1] != 0) {
          DockBuilderDockWindow(dst_name,local_58.Data[lVar6 + 1]);
          goto LAB_00158b86;
        }
        break;
      }
    }
    DockBuilderCopyWindowSettings(data_p,dst_name);
LAB_00158b86:
    lVar7 = lVar7 + 2;
  } while( true );
}

Assistant:

void ImGui::DockBuilderCopyDockSpace(ImGuiID src_dockspace_id, ImGuiID dst_dockspace_id, ImVector<const char*>* in_window_remap_pairs)
{
    IM_ASSERT(src_dockspace_id != 0);
    IM_ASSERT(dst_dockspace_id != 0);
    IM_ASSERT(in_window_remap_pairs != NULL);
    IM_ASSERT((in_window_remap_pairs->Size % 2) == 0);

    // Duplicate entire dock
    // FIXME: When overwriting dst_dockspace_id, windows that aren't part of our dockspace window class but that are docked in a same node will be split apart,
    // whereas we could attempt to at least keep them together in a new, same floating node.
    ImVector<ImGuiID> node_remap_pairs;
    DockBuilderCopyNode(src_dockspace_id, dst_dockspace_id, &node_remap_pairs);

    // Attempt to transition all the upcoming windows associated to dst_dockspace_id into the newly created hierarchy of dock nodes
    // (The windows associated to src_dockspace_id are staying in place)
    ImVector<ImGuiID> src_windows;
    for (int remap_window_n = 0; remap_window_n < in_window_remap_pairs->Size; remap_window_n += 2)
    {
        const char* src_window_name = (*in_window_remap_pairs)[remap_window_n];
        const char* dst_window_name = (*in_window_remap_pairs)[remap_window_n + 1];
        ImGuiID src_window_id = ImHashStr(src_window_name);
        src_windows.push_back(src_window_id);

        // Search in the remapping tables
        ImGuiID src_dock_id = 0;
        if (ImGuiWindow* src_window = FindWindowByID(src_window_id))
            src_dock_id = src_window->DockId;
        else if (ImGuiWindowSettings* src_window_settings = FindWindowSettings(src_window_id))
            src_dock_id = src_window_settings->DockId;
        ImGuiID dst_dock_id = 0;
        for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
            if (node_remap_pairs[dock_remap_n] == src_dock_id)
            {
                dst_dock_id = node_remap_pairs[dock_remap_n + 1];
                //node_remap_pairs[dock_remap_n] = node_remap_pairs[dock_remap_n + 1] = 0; // Clear
                break;
            }

        if (dst_dock_id != 0)
        {
            // Docked windows gets redocked into the new node hierarchy.
            IMGUI_DEBUG_LOG_DOCKING("Remap live window '%s' 0x%08X -> '%s' 0x%08X\n", src_window_name, src_dock_id, dst_window_name, dst_dock_id);
            DockBuilderDockWindow(dst_window_name, dst_dock_id);
        }
        else
        {
            // Floating windows gets their settings transferred (regardless of whether the new window already exist or not)
            // When this is leading to a Copy and not a Move, we would get two overlapping floating windows. Could we possibly dock them together?
            IMGUI_DEBUG_LOG_DOCKING("Remap window settings '%s' -> '%s'\n", src_window_name, dst_window_name);
            DockBuilderCopyWindowSettings(src_window_name, dst_window_name);
        }
    }

    // Anything else in the source nodes of 'node_remap_pairs' are windows that were docked in src_dockspace_id but are not owned by it (unaffiliated windows, e.g. "ImGui Demo")
    // Find those windows and move to them to the cloned dock node. This may be optional?
    for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
        if (ImGuiID src_dock_id = node_remap_pairs[dock_remap_n])
        {
            ImGuiID dst_dock_id = node_remap_pairs[dock_remap_n + 1];
            ImGuiDockNode* node = DockBuilderGetNode(src_dock_id);
            for (int window_n = 0; window_n < node->Windows.Size; window_n++)
            {
                ImGuiWindow* window = node->Windows[window_n];
                if (src_windows.contains(window->ID))
                    continue;

                // Docked windows gets redocked into the new node hierarchy.
                IMGUI_DEBUG_LOG_DOCKING("Remap window '%s' %08X -> %08X\n", window->Name, src_dock_id, dst_dock_id);
                DockBuilderDockWindow(window->Name, dst_dock_id);
            }
        }
}